

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

ExceptionOr<capnp::Capability::Client> * __thiscall
kj::_::ExceptionOr<capnp::Capability::Client>::operator=
          (ExceptionOr<capnp::Capability::Client> *this,
          ExceptionOr<capnp::Capability::Client> *param_1)

{
  ExceptionOr<capnp::Capability::Client> *param_1_local;
  ExceptionOr<capnp::Capability::Client> *this_local;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  Maybe<capnp::Capability::Client>::operator=(&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;